

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

void __thiscall ncnn::Convolution_x86::Convolution_x86(Convolution_x86 *this)

{
  Convolution::Convolution(&this->super_Convolution);
  (this->super_Convolution).super_Layer._vptr_Layer = (_func_int **)&PTR__Convolution_x86_00601338;
  (this->weight_winograd63_data).cstep = 0;
  (this->scale_in_data).cstep = 0;
  (this->weight_data_tm).data = (void *)0x0;
  (this->weight_data_tm).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
  (this->weight_data_tm).allocator = (Allocator *)0x0;
  (this->weight_data_tm).dims = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).h = 0;
  (this->weight_data_tm).d = 0;
  (this->weight_data_tm).c = 0;
  (this->weight_data_tm).cstep = 0;
  (this->weight_sgemm_data).data = (void *)0x0;
  (this->weight_sgemm_data).refcount = (int *)0x0;
  (this->weight_sgemm_data).elemsize = 0;
  (this->weight_sgemm_data).elempack = 0;
  (this->weight_sgemm_data).allocator = (Allocator *)0x0;
  (this->weight_sgemm_data).dims = 0;
  (this->weight_sgemm_data).w = 0;
  (this->weight_sgemm_data).w = 0;
  (this->weight_sgemm_data).h = 0;
  (this->weight_sgemm_data).d = 0;
  (this->weight_sgemm_data).c = 0;
  (this->weight_sgemm_data).cstep = 0;
  (this->weight_winograd23_data).data = (void *)0x0;
  (this->weight_winograd23_data).refcount = (int *)0x0;
  (this->weight_winograd23_data).elemsize = 0;
  (this->weight_winograd23_data).elempack = 0;
  (this->weight_winograd23_data).allocator = (Allocator *)0x0;
  (this->weight_winograd23_data).dims = 0;
  (this->weight_winograd23_data).w = 0;
  (this->weight_winograd23_data).w = 0;
  (this->weight_winograd23_data).h = 0;
  (this->weight_winograd23_data).d = 0;
  (this->weight_winograd23_data).c = 0;
  (this->weight_winograd23_data).cstep = 0;
  (this->weight_winograd43_data).data = (void *)0x0;
  (this->weight_winograd43_data).refcount = (int *)0x0;
  (this->weight_winograd43_data).elemsize = 0;
  (this->weight_winograd43_data).elempack = 0;
  (this->weight_winograd43_data).w = 0;
  (this->weight_winograd43_data).h = 0;
  (this->weight_winograd43_data).d = 0;
  (this->weight_winograd43_data).c = 0;
  (this->weight_winograd43_data).allocator = (Allocator *)0x0;
  (this->weight_winograd43_data).dims = 0;
  (this->weight_winograd43_data).w = 0;
  (this->weight_winograd63_data).elempack = 0;
  (this->weight_winograd63_data).refcount = (int *)0x0;
  (this->weight_winograd63_data).elemsize = 0;
  (this->weight_winograd43_data).cstep = 0;
  (this->weight_winograd63_data).data = (void *)0x0;
  (this->weight_winograd63_data).w = 0;
  (this->weight_winograd63_data).h = 0;
  (this->weight_winograd63_data).d = 0;
  (this->weight_winograd63_data).c = 0;
  (this->weight_winograd63_data).allocator = (Allocator *)0x0;
  (this->weight_winograd63_data).dims = 0;
  (this->weight_winograd63_data).w = 0;
  *(undefined8 *)((long)&(this->scale_in_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->scale_in_data).elemsize + 4) = 0;
  (this->scale_in_data).data = (void *)0x0;
  (this->scale_in_data).refcount = (int *)0x0;
  (this->scale_in_data).w = 0;
  (this->scale_in_data).h = 0;
  (this->scale_in_data).d = 0;
  (this->scale_in_data).c = 0;
  (this->scale_in_data).allocator = (Allocator *)0x0;
  (this->scale_in_data).dims = 0;
  (this->scale_in_data).w = 0;
  (this->super_Convolution).super_Layer.support_packing = true;
  this->activation = (Layer *)0x0;
  this->nT = 0;
  this->convolution_dilation1 = (Layer *)0x0;
  return;
}

Assistant:

Convolution_x86::Convolution_x86()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    nT = 0;
    convolution_dilation1 = 0;
}